

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceEntryPoint
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *use)

{
  IRContext *pIVar1;
  bool bVar2;
  bool bVar3;
  DescriptorScalarReplacement *this_00;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  pointer pOVar8;
  long lVar9;
  ulong uVar10;
  OperandList new_operands;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_c8;
  DescriptorScalarReplacement *local_b0;
  undefined1 local_a8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_88;
  undefined1 local_80 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  string local_50;
  
  local_c8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar8 = (use->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(use->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8 >> 4) *
          -0x5555555555555555;
  if ((int)uVar6 != 0) {
    lVar9 = 0;
    uVar10 = 0;
    local_b0 = this;
    bVar3 = false;
    do {
      if (uVar6 <= uVar10) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
      }
      if (*(int *)((long)((pOVar8->words).buffer + 0xfffffffffffffffa) + lVar9) == 1) {
        puVar7 = *(undefined8 **)((long)((pOVar8->words).buffer + 4) + lVar9);
        if (puVar7 == (undefined8 *)0x0) {
          puVar7 = (undefined8 *)((long)((pOVar8->words).buffer + 2) + lVar9);
        }
        uVar5 = *(uint32_t *)*puVar7;
        uVar4 = 0;
        if (var->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
        }
        bVar2 = true;
        if (uVar5 != uVar4) goto LAB_005989b7;
      }
      else {
LAB_005989b7:
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_c8,
                   (Operand *)((long)((pOVar8->words).buffer + 0xfffffffffffffffa) + lVar9));
        bVar2 = bVar3;
      }
      this_00 = local_b0;
      uVar10 = uVar10 + 1;
      pOVar8 = (use->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(use->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8 >> 4) *
              -0x5555555555555555;
      lVar9 = lVar9 + 0x30;
      bVar3 = bVar2;
    } while (uVar10 < (uVar6 & 0xffffffff));
    this = local_b0;
    if (bVar2) {
      uVar5 = descsroautil::GetNumberOfElementsForArrayOrStruct((local_b0->super_Pass).context_,var)
      ;
      if (uVar5 != 0) {
        uVar4 = 0;
        do {
          local_a8._16_4_ = GetReplacementVariable(this_00,var,uVar4);
          local_a8._0_8_ = &PTR__SmallVector_00930a20;
          local_a8._24_8_ = local_a8 + 0x10;
          local_88._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a8._8_8_ = 1;
          local_80._0_4_ = SPV_OPERAND_TYPE_ID;
          local_80._8_8_ = &PTR__SmallVector_00930a20;
          local_80._16_8_ = 0;
          local_80._32_8_ = local_80 + 0x18;
          local_58._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_80 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_a8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_c8,(Operand *)local_80);
          local_80._8_8_ = &PTR__SmallVector_00930a20;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_58._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_58,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_58._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          local_58._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_a8._0_8_ = &PTR__SmallVector_00930a20;
          if (local_88._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_88,local_88._M_head_impl);
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      Instruction::ReplaceOperands(use,&local_c8);
      pIVar1 = (this_00->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,use);
      }
      goto LAB_00598b71;
    }
  }
  pIVar1 = (this->super_Pass).context_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Variable cannot be replaced: invalid instruction","");
  IRContext::EmitErrorMessage(pIVar1,&local_50,use);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_00598b71:
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_c8);
  return bVar2;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceEntryPoint(Instruction* var,
                                                    Instruction* use) {
  // Build a new |OperandList| for |use| that removes |var| and adds its
  // replacement variables.
  Instruction::OperandList new_operands;

  // Copy all operands except |var|.
  bool found = false;
  for (uint32_t idx = 0; idx < use->NumOperands(); idx++) {
    Operand& op = use->GetOperand(idx);
    if (op.type == SPV_OPERAND_TYPE_ID && op.words[0] == var->result_id()) {
      found = true;
    } else {
      new_operands.emplace_back(op);
    }
  }

  if (!found) {
    context()->EmitErrorMessage(
        "Variable cannot be replaced: invalid instruction", use);
    return false;
  }

  // Add all new replacement variables.
  uint32_t num_replacement_vars =
      descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
  for (uint32_t i = 0; i < num_replacement_vars; i++) {
    new_operands.push_back(
        {SPV_OPERAND_TYPE_ID, {GetReplacementVariable(var, i)}});
  }

  use->ReplaceOperands(new_operands);
  context()->UpdateDefUse(use);
  return true;
}